

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::RegisterCommand::~RegisterCommand(RegisterCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CommandMixin<(wabt::CommandType)3>).super_Command._vptr_Command =
       (_func_int **)&PTR__RegisterCommand_001cc9d8;
  Var::~Var(&this->var);
  pcVar2 = (this->module_name)._M_dataplus._M_p;
  paVar1 = &(this->module_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x78);
  return;
}

Assistant:

RegisterCommand(std::string_view module_name, const Var& var)
      : module_name(module_name), var(var) {}